

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

void __thiscall
cmQtAutoMocUic::JobParseT::CreateKeys
          (JobParseT *this,
          vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
          *container,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *source,size_t basePrefixLength)

{
  size_type __n;
  _Base_ptr p_Var1;
  size_t local_28;
  
  __n = (source->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (__n != 0) {
    local_28 = basePrefixLength;
    std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::reserve
              (container,__n);
    for (p_Var1 = (source->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(source->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::vector<cmQtAutoMocUic::IncludeKeyT,std::allocator<cmQtAutoMocUic::IncludeKeyT>>::
      emplace_back<std::__cxx11::string_const&,unsigned_long&>
                ((vector<cmQtAutoMocUic::IncludeKeyT,std::allocator<cmQtAutoMocUic::IncludeKeyT>> *)
                 container,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1),
                 &local_28);
    }
  }
  return;
}

Assistant:

void cmQtAutoMocUic::JobParseT::CreateKeys(std::vector<IncludeKeyT>& container,
                                           std::set<std::string> const& source,
                                           std::size_t basePrefixLength)
{
  if (source.empty()) {
    return;
  }
  container.reserve(source.size());
  for (std::string const& src : source) {
    container.emplace_back(src, basePrefixLength);
  }
}